

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O0

size_t JEBDebug::internal::print_characters
                 (ostream *stream,void *data,size_t num_bytes,size_t num_chars)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  uchar *cdata;
  unsigned_long n;
  size_t i;
  size_t num_chars_local;
  size_t num_bytes_local;
  void *data_local;
  ostream *stream_local;
  
  n = 0;
  i = num_chars;
  num_chars_local = num_bytes;
  num_bytes_local = (size_t)data;
  data_local = stream;
  puVar3 = std::min<unsigned_long>(&num_chars_local,&i);
  sVar2 = num_bytes_local;
  uVar1 = *puVar3;
  for (; n < uVar1; n = n + 1) {
    if ((*(byte *)(sVar2 + n) < 0x20) || (0x7e < *(byte *)(sVar2 + n))) {
      std::ostream::put((char)data_local);
    }
    else {
      std::ostream::put((char)data_local);
    }
  }
  for (; n < i; n = n + 1) {
    std::ostream::put((char)data_local);
  }
  return uVar1;
}

Assistant:

inline size_t print_characters(std::ostream& stream,
                                       const void* data, size_t num_bytes,
                                       size_t num_chars)
        {
            size_t i = 0;
            auto n = std::min(num_bytes, num_chars);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
            {
                if (32 <= cdata[i] && cdata[i] < 127)
                    stream.put(char(cdata[i]));
                else
                    stream.put('.');
            }
            for (; i < num_chars; ++i)
                stream.put(' ');
            return n;
        }